

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall
SQClass::NewSlot(SQClass *this,SQSharedState *ss,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQTable *pSVar1;
  bool bVar2;
  SQClosure *x;
  SQUnsignedInteger SVar3;
  SQClassMember *pSVar4;
  byte local_e1;
  SQObjectPtr local_e0;
  undefined1 local_d0 [8];
  SQClassMember m;
  undefined1 local_a0 [8];
  SQClassMember m_1;
  undefined1 local_78 [7];
  bool isconstructor;
  SQObjectPtr theval;
  SQInteger mmidx;
  undefined1 local_48 [7];
  bool belongs_to_static_table;
  SQObjectPtr temp;
  bool bstatic_local;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQSharedState *ss_local;
  SQClass *this_local;
  
  temp.super_SQObject._unVal.nInteger._7_1_ = bstatic;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  local_e1 = 1;
  if (((val->super_SQObject)._type != OT_CLOSURE) &&
     (local_e1 = 1, (val->super_SQObject)._type != OT_NATIVECLOSURE)) {
    local_e1 = temp.super_SQObject._unVal.nInteger._7_1_;
  }
  if (((this->_locked & 1U) == 0) || ((local_e1 & 1) != 0)) {
    bVar2 = SQTable::Get(this->_members,key,(SQObjectPtr *)local_48);
    if ((bVar2) && ((temp.super_SQObject._0_8_ & 0x2000000) != 0)) {
      pSVar4 = sqvector<SQClassMember>::operator[]
                         (&this->_defaultvalues,(ulong)(temp.super_SQObject._type & 0xffffff));
      ::SQObjectPtr::operator=(&pSVar4->val,val);
      this_local._7_1_ = true;
    }
    else if ((local_e1 & 1) == 0) {
      SQClassMember::SQClassMember((SQClassMember *)local_d0);
      ::SQObjectPtr::operator=((SQObjectPtr *)local_d0,val);
      pSVar1 = this->_members;
      SVar3 = sqvector<SQClassMember>::size(&this->_defaultvalues);
      ::SQObjectPtr::SQObjectPtr(&local_e0,SVar3 | 0x2000000);
      SQTable::NewSlot(pSVar1,key,&local_e0);
      ::SQObjectPtr::~SQObjectPtr(&local_e0);
      sqvector<SQClassMember>::push_back(&this->_defaultvalues,(SQClassMember *)local_d0);
      this_local._7_1_ = true;
      SQClassMember::~SQClassMember((SQClassMember *)local_d0);
    }
    else {
      if ((((val->super_SQObject)._type == OT_CLOSURE) ||
          ((val->super_SQObject)._type == OT_NATIVECLOSURE)) &&
         (theval.super_SQObject._unVal.nInteger = SQSharedState::GetMetaMethodIdxByName(ss,key),
         theval.super_SQObject._unVal.pTable != (SQTable *)0xffffffffffffffff)) {
        ::SQObjectPtr::operator=(this->_metamethods + theval.super_SQObject._unVal.nInteger,val);
      }
      else {
        ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_78,val);
        if ((this->_base != (SQClass *)0x0) && ((val->super_SQObject)._type == OT_CLOSURE)) {
          x = SQClosure::Clone((val->super_SQObject)._unVal.pClosure);
          ::SQObjectPtr::operator=((SQObjectPtr *)local_78,x);
          *(SQClass **)(theval.super_SQObject._0_8_ + 0x40) = this->_base;
          (this->_base->super_SQCollectable).super_SQRefCounted._uiRef =
               (this->_base->super_SQCollectable).super_SQRefCounted._uiRef + 1;
        }
        if (local_48._0_4_ == OT_NULL) {
          SQVM::IsEqual(&ss->_constructoridx,key,
                        (bool *)((long)&m_1.attrs.super_SQObject._unVal + 7));
          if ((m_1.attrs.super_SQObject._unVal.nInteger._7_1_ & 1) != 0) {
            SVar3 = sqvector<SQClassMember>::size(&this->_methods);
            this->_constructoridx = SVar3;
          }
          SQClassMember::SQClassMember((SQClassMember *)local_a0);
          ::SQObjectPtr::operator=((SQObjectPtr *)local_a0,(SQObjectPtr *)local_78);
          pSVar1 = this->_members;
          SVar3 = sqvector<SQClassMember>::size(&this->_methods);
          ::SQObjectPtr::SQObjectPtr
                    ((SQObjectPtr *)&m.attrs.super_SQObject._unVal,SVar3 | 0x1000000);
          SQTable::NewSlot(pSVar1,key,(SQObjectPtr *)&m.attrs.super_SQObject._unVal);
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&m.attrs.super_SQObject._unVal);
          sqvector<SQClassMember>::push_back(&this->_methods,(SQClassMember *)local_a0);
          SQClassMember::~SQClassMember((SQClassMember *)local_a0);
        }
        else {
          pSVar4 = sqvector<SQClassMember>::operator[]
                             (&this->_methods,(ulong)(temp.super_SQObject._type & 0xffffff));
          ::SQObjectPtr::operator=(&pSVar4->val,(SQObjectPtr *)local_78);
        }
        ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_78);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
  return this_local._7_1_;
}

Assistant:

bool SQClass::NewSlot(SQSharedState *ss,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    SQObjectPtr temp;
    bool belongs_to_static_table = type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE || bstatic;
    if(_locked && !belongs_to_static_table)
        return false; //the class already has an instance so cannot be modified
    if(_members->Get(key,temp) && _isfield(temp)) //overrides the default value
    {
        _defaultvalues[_member_idx(temp)].val = val;
        return true;
    }
    if(belongs_to_static_table) {
        SQInteger mmidx;
        if((type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE) &&
            (mmidx = ss->GetMetaMethodIdxByName(key)) != -1) {
            _metamethods[mmidx] = val;
        }
        else {
            SQObjectPtr theval = val;
            if(_base && type(val) == OT_CLOSURE) {
                theval = _closure(val)->Clone();
                _closure(theval)->_base = _base;
                __ObjAddRef(_base); //ref for the closure
            }
            if(type(temp) == OT_NULL) {
                bool isconstructor;
                SQVM::IsEqual(ss->_constructoridx, key, isconstructor);
                if(isconstructor) {
                    _constructoridx = (SQInteger)_methods.size();
                }
                SQClassMember m;
                m.val = theval;
                _members->NewSlot(key,SQObjectPtr(_make_method_idx(_methods.size())));
                _methods.push_back(m);
            }
            else {
                _methods[_member_idx(temp)].val = theval;
            }
        }
        return true;
    }
    SQClassMember m;
    m.val = val;
    _members->NewSlot(key,SQObjectPtr(_make_field_idx(_defaultvalues.size())));
    _defaultvalues.push_back(m);
    return true;
}